

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::UnlinkInstr(BasicBlock *this,Instr *instr)

{
  IRKind IVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Func **ppFVar6;
  long lVar7;
  
  bVar4 = Contains(this,instr);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd76,"(this->Contains(instr))","this->Contains(instr)");
    if (!bVar4) goto LAB_0041fbe9;
    *puVar5 = 0;
  }
  pBVar2 = this->next;
  ppFVar6 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar6 = &this->func;
  }
  lVar7 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar7 = 0xd0;
  }
  if (this->firstInstr == *(Instr **)((long)&(*ppFVar6)->m_alloc + lVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd77,"(this->GetFirstInstr() != this->GetLastInstr())",
                       "this->GetFirstInstr() != this->GetLastInstr()");
    if (!bVar4) goto LAB_0041fbe9;
    *puVar5 = 0;
  }
  if (this->firstInstr == instr) {
    IVar1 = this->firstInstr->m_kind;
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xd7a,"(!this->GetFirstInstr()->IsLabelInstr())",
                         "!this->GetFirstInstr()->IsLabelInstr()");
      if (!bVar4) {
LAB_0041fbe9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    this->firstInstr = instr->m_next;
  }
  IR::Instr::Unlink(instr);
  return;
}

Assistant:

void
BasicBlock::UnlinkInstr(IR::Instr * instr)
{
    Assert(this->Contains(instr));
    Assert(this->GetFirstInstr() != this->GetLastInstr());
    if (instr == this->GetFirstInstr())
    {
        Assert(!this->GetFirstInstr()->IsLabelInstr());
        this->SetFirstInstr(instr->m_next);
    }
    else if (instr == this->GetLastInstr())
    {
        this->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();
}